

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void divsufsortxx::helper::
     fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
               (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator SA,long i
               ,long size)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  value_type vVar6;
  long lVar7;
  pos_type pVar8;
  BitmapArray<long> *pBVar9;
  value_reference local_50;
  value_reference local_40;
  
  pVar8 = SA.pos_;
  pBVar9 = SA.array_;
  iVar4 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,pVar8 + i);
  vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (&Td,CONCAT44(extraout_var,iVar4));
  while (lVar7 = i * 2 + 1, lVar7 < size) {
    iVar5 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,lVar7 + pVar8);
    vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (&Td,CONCAT44(extraout_var_00,iVar5));
    iVar5 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,i * 2 + pVar8 + 2);
    vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (&Td,CONCAT44(extraout_var_01,iVar5));
    vVar6 = vVar2;
    if (vVar2 <= vVar3) {
      vVar6 = vVar3;
    }
    if (vVar6 <= vVar1) break;
    if (vVar2 < vVar3) {
      lVar7 = i * 2 + 2;
    }
    local_40.pos_ = lVar7 + pVar8;
    local_50.pos_ = i + pVar8;
    local_50.array_ = pBVar9;
    local_40.array_ = pBVar9;
    bitmap::BitmapArray<long>::value_reference::operator=(&local_50,&local_40);
    i = lVar7;
  }
  (*(pBVar9->super_Bitmap)._vptr_Bitmap[4])(pBVar9,i + pVar8,CONCAT44(extraout_var,iVar4));
  return;
}

Assistant:

void fixdown(const StringIterator_type Td, SAIterator_type SA, pos_type i,
             pos_type size) {
  typedef typename std::iterator_traits<StringIterator_type>::value_type value_type;
  pos_type j, k, t;
  value_type c, d, e;

  for (t = SA[i], c = Td[t]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = Td[SA[k = j++]];
    if (d < (e = Td[SA[j]])) {
      k = j;
      d = e;
    }
    if (d <= c) {
      break;
    }
  }
  SA[i] = t;
}